

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

FT_Error FT_Glyph_StrokeBorder(FT_Glyph *pglyph,FT_Stroker stroker,FT_Bool inside,FT_Bool destroy)

{
  FT_Outline *outline;
  FT_Glyph pFVar1;
  FT_Error FVar2;
  FT_UInt local_4c;
  FT_UInt FStack_48;
  FT_UInt num_contours;
  FT_Glyph copy;
  FT_StrokerBorder local_34;
  
  if (pglyph == (FT_Glyph *)0x0) {
    return 6;
  }
  pFVar1 = *pglyph;
  if (pFVar1 == (FT_Glyph)0x0) {
    return 6;
  }
  if (pFVar1->clazz != &ft_outline_glyph_class) {
    return 6;
  }
  FVar2 = FT_Glyph_Copy(pFVar1,(FT_Glyph *)&stack0xffffffffffffffb8);
  if (FVar2 != 0) {
    return FVar2;
  }
  copy = (FT_Glyph)CONCAT44(num_contours,FStack_48);
  outline = (FT_Outline *)(copy + 1);
  local_34 = FT_Outline_GetOutsideBorder(outline);
  FVar2 = FT_Stroker_ParseOutline(stroker,outline,'\0');
  if (FVar2 == 0) {
    local_34 = local_34 ^ inside != '\0';
    FT_Stroker_GetBorderCounts(stroker,local_34,&stack0xffffffffffffffb8,&local_4c);
    pFVar1 = copy;
    FT_Outline_Done(copy->library,outline);
    FVar2 = FT_Outline_New(pFVar1->library,FStack_48,local_4c,outline);
    if (FVar2 == 0) {
      *(undefined4 *)&copy[1].library = 0;
      FT_Stroker_ExportBorder(stroker,local_34,outline);
      FVar2 = 0;
      if (destroy != '\0') {
        FT_Done_Glyph(*pglyph);
      }
      goto LAB_001f3da7;
    }
  }
  FT_Done_Glyph(copy);
  if (destroy != '\0') {
    return FVar2;
  }
  copy = (FT_Glyph)0x0;
LAB_001f3da7:
  *pglyph = copy;
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_StrokeBorder( FT_Glyph    *pglyph,
                         FT_Stroker   stroker,
                         FT_Bool      inside,
                         FT_Bool      destroy )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_Glyph  glyph = NULL;

    /* for FT_OUTLINE_GLYPH_CLASS_GET (in PIC mode) */
    FT_Library  library = stroker->library;

    FT_UNUSED( library );


    if ( !pglyph )
      goto Exit;

    glyph = *pglyph;
    if ( !glyph || glyph->clazz != FT_OUTLINE_GLYPH_CLASS_GET )
      goto Exit;

    {
      FT_Glyph  copy;


      error = FT_Glyph_Copy( glyph, &copy );
      if ( error )
        goto Exit;

      glyph = copy;
    }

    {
      FT_OutlineGlyph   oglyph  = (FT_OutlineGlyph)glyph;
      FT_StrokerBorder  border;
      FT_Outline*       outline = &oglyph->outline;
      FT_UInt           num_points, num_contours;


      border = FT_Outline_GetOutsideBorder( outline );
      if ( inside )
      {
        if ( border == FT_STROKER_BORDER_LEFT )
          border = FT_STROKER_BORDER_RIGHT;
        else
          border = FT_STROKER_BORDER_LEFT;
      }

      error = FT_Stroker_ParseOutline( stroker, outline, FALSE );
      if ( error )
        goto Fail;

      FT_Stroker_GetBorderCounts( stroker, border,
                                  &num_points, &num_contours );

      FT_Outline_Done( glyph->library, outline );

      error = FT_Outline_New( glyph->library,
                              num_points,
                              (FT_Int)num_contours,
                              outline );
      if ( error )
        goto Fail;

      outline->n_points   = 0;
      outline->n_contours = 0;

      FT_Stroker_ExportBorder( stroker, border, outline );
    }

    if ( destroy )
      FT_Done_Glyph( *pglyph );

    *pglyph = glyph;
    goto Exit;

  Fail:
    FT_Done_Glyph( glyph );
    glyph = NULL;

    if ( !destroy )
      *pglyph = NULL;

  Exit:
    return error;
  }